

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[38],kj::StringPtr&,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,char (*params) [38],StringPtr *params_1,
          char (*params_2) [2])

{
  char (*value) [38];
  StringPtr *value_00;
  char (*value_01) [2];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  StringPtr *local_28;
  char (*params_local_2) [2];
  StringPtr *params_local_1;
  char (*params_local) [38];
  
  local_28 = params_1;
  params_local_2 = (char (*) [2])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [38])__return_storage_ptr__;
  value = ::const((char (*) [38])this);
  local_38 = toCharSequence<char_const(&)[38]>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_48 = toCharSequence<kj::StringPtr&>(value_00);
  value_01 = ::const((char (*) [2])local_28);
  local_58 = toCharSequence<char_const(&)[2]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}